

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O0

BVIndex __thiscall BVFixed::Count(BVFixed *this)

{
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  undefined4 *puVar4;
  uint local_18;
  uint local_14;
  BVIndex i;
  BVIndex sum;
  BVFixed *this_local;
  
  local_14 = 0;
  local_18 = 0;
  while( true ) {
    BVar3 = WordCount(this);
    if (BVar3 <= local_18) break;
    BVar3 = BVUnitT<unsigned_long>::Count((BVUnitT<unsigned_long> *)(this + (ulong)local_18 + 1));
    local_14 = BVar3 + local_14;
    local_18 = local_18 + 1;
  }
  BVar3 = Length(this);
  if (BVar3 < local_14) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.cpp"
                       ,0x141,"(sum <= this->Length())","sum <= this->Length()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return local_14;
}

Assistant:

BVIndex
BVFixed::Count() const
{
    BVIndex sum = 0;
    for (BVIndex i=0; i < this->WordCount(); i++)
    {
        sum += this->data[i].Count();
    }
    Assert(sum <= this->Length());
    return sum;
}